

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O2

bool __thiscall
QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView>::isNull
          (QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView> *this)

{
  if (((this->a).a.m_data == (storage_type_conflict *)0x0) && (((this->a).b)->m_data == (char *)0x0)
     ) {
    return (this->b).m_data == (storage_type_conflict *)0x0;
  }
  return false;
}

Assistant:

[[nodiscard]] constexpr bool isNull() const noexcept { return !m_data; }